

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O3

void __thiscall
xmotion::
Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
::AddEdge(Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>
          *this,shared_ptr<xmotion::StateExample> *sstate,shared_ptr<xmotion::StateExample> *dstate,
         double trans)

{
  long *plVar1;
  Vertex *this_00;
  long lVar2;
  vertex_iterator vVar3;
  edge_iterator eVar4;
  ostream *poVar5;
  vertex_iterator vVar6;
  _List_node_base *p_Var7;
  shared_ptr<xmotion::StateExample> local_50;
  shared_ptr<xmotion::StateExample> local_40;
  shared_ptr<xmotion::StateExample> local_30;
  
  local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (sstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  vVar3 = ObtainVertexFromVertexMap(this,&local_30);
  if (local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00 = *(Vertex **)
             ((long)vVar3.super_const_vertex_iterator.super_VertexMapTypeIterator.
                    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                    ._M_cur + 0x10);
  local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (dstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (dstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  eVar4 = Vertex::FindEdge<std::shared_ptr<xmotion::StateExample>,_nullptr>(this_00,&local_40);
  if (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (eVar4._M_node ==
      (_List_node_base *)
      (*(long *)((long)vVar3.super_const_vertex_iterator.super_VertexMapTypeIterator.
                       super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                       ._M_cur + 0x10) + 0x20)) {
    local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (dstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (dstate->super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
    if (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    vVar6 = ObtainVertexFromVertexMap(this,&local_50);
    if (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<xmotion::StateExample,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar2 = *(long *)((long)vVar6.super_const_vertex_iterator.super_VertexMapTypeIterator.
                            super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                            ._M_cur + 0x10);
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next =
         (_List_node_base *)
         vVar3.super_const_vertex_iterator.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
         ._M_cur;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    plVar1 = (long *)(lVar2 + 0x48);
    *plVar1 = *plVar1 + 1;
    lVar2 = *(long *)((long)vVar3.super_const_vertex_iterator.super_VertexMapTypeIterator.
                            super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
                            ._M_cur + 0x10);
    p_Var7 = (_List_node_base *)operator_new(0x28);
    p_Var7[1]._M_next =
         (_List_node_base *)
         vVar3.super_const_vertex_iterator.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
         ._M_cur;
    p_Var7[1]._M_prev =
         (_List_node_base *)
         vVar6.super_const_vertex_iterator.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<std::shared_ptr<xmotion::StateExample>,_double,_xmotion::DefaultIndexer<std::shared_ptr<xmotion::StateExample>_>_>::Vertex_*>,_false>
         ._M_cur;
    p_Var7[2]._M_next = (_List_node_base *)trans;
    std::__detail::_List_node_base::_M_hook(p_Var7);
    plVar1 = (long *)(lVar2 + 0x30);
    *plVar1 = *plVar1 + 1;
  }
  else {
    eVar4._M_node[2]._M_next = (_List_node_base *)trans;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"updated cost: ",0xe);
    poVar5 = std::ostream::_M_insert<double>(trans);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return;
}

Assistant:

void Graph<State, Transition, StateIndexer>::AddEdge(State sstate, State dstate,
                                                     Transition trans) {
  auto src_vertex = ObtainVertexFromVertexMap(sstate);

  // update transition if edge already exists
  auto it = src_vertex->FindEdge(dstate);
  if (it != src_vertex->edge_end()) {
    it->cost = trans;
    std::cout << "updated cost: " << trans << std::endl;
    return;
  }

  // otherwise add new edge
  auto dst_vertex = ObtainVertexFromVertexMap(dstate);
  dst_vertex->vertices_from.push_back(src_vertex);
  src_vertex->edges_to.emplace_back(src_vertex, dst_vertex, trans);
}